

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(void)

{
  initializer_list<int> __l;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> vec;
  int local_38 [12];
  
  local_38[4] = 0x20;
  local_38[5] = 1;
  local_38[6] = 0x2e;
  local_38[7] = 99999;
  local_38[0] = 0x59;
  local_38[1] = 0x4e;
  local_38[2] = 0x43;
  local_38[3] = 1;
  local_38[8] = 0x3e0;
  __l._M_len = 9;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&vec,__l,&local_51);
  std::operator<<((ostream *)&std::cout,"Before: ");
  show(&vec);
  insertionSort<int>(&vec);
  std::operator<<((ostream *)&std::cout,"After: ");
  show(&vec);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vec.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
    vector<int> vec = {89, 78, 67, 1, 32, 1, 46, 99999, 992};
    cout << "Before: ";
    show(vec);
    insertionSort(vec);
    cout << "After: ";
    show(vec);
    return 0;
}